

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscTests.cpp
# Opt level: O0

void __thiscall agge::tests::MiscTests::RawMemoryObjectReturnsNonNullAddress(MiscTests *this)

{
  allocator local_d9;
  string local_d8 [32];
  LocationInfo local_b8;
  double *local_90;
  allocator local_81;
  string local_80 [32];
  LocationInfo local_60;
  int *local_28;
  undefined1 local_20 [8];
  raw_memory_object rmo;
  MiscTests *this_local;
  
  rmo._8_8_ = this;
  raw_memory_object::raw_memory_object((raw_memory_object *)local_20);
  local_28 = raw_memory_object::get<int>((raw_memory_object *)local_20,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_80,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/MiscTests.cpp"
             ,&local_81);
  ut::LocationInfo::LocationInfo(&local_60,(string *)local_80,0x1b);
  ut::is_not_null<int*>(&local_28,&local_60);
  ut::LocationInfo::~LocationInfo(&local_60);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  local_90 = raw_memory_object::get<double>((raw_memory_object *)local_20,5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_d8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/MiscTests.cpp"
             ,&local_d9);
  ut::LocationInfo::LocationInfo(&local_b8,(string *)local_d8,0x1c);
  ut::is_not_null<double*>(&local_90,&local_b8);
  ut::LocationInfo::~LocationInfo(&local_b8);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  raw_memory_object::~raw_memory_object((raw_memory_object *)local_20);
  return;
}

Assistant:

test( RawMemoryObjectReturnsNonNullAddress )
			{
				// INIT / ACT
				raw_memory_object rmo;

				// ACT / ASSERT
				assert_not_null(rmo.get<int>(1));
				assert_not_null(rmo.get<double>(5));
			}